

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# de.cpp
# Opt level: O2

string * de_abi_cxx11_(void)

{
  char *__s;
  allocator<char> *__a;
  string *in_RDI;
  long lVar1;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  lVar1 = 0;
  do {
    if (lVar1 == 0x28) {
      __s = "Unknown";
      __a = &local_1a;
      goto LAB_0011c526;
    }
    __s = getenv(*(char **)((long)&PTR_anon_var_dwarf_5c9e9_0013faa0 + lVar1));
    lVar1 = lVar1 + 8;
  } while (__s == (char *)0x0);
  __a = &local_19;
LAB_0011c526:
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,__a);
  return in_RDI;
}

Assistant:

std::string de() {
  constexpr std::array<const char*, 5> env_vars = {
    "XDG_CURRENT_DESKTOP",
    "DESKTOP_SESSION",
    "XDG_SESSION_DESKTOP",
    "CURRENT_DESKTOP",
    "SESSION_DESKTOP"
  };

  for (const char* var : env_vars) {
    if (const char *desktop_session = std::getenv(var)) {
      return std::string(desktop_session);
    }
  }

  return "Unknown";
}